

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O2

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateColumn
          (HtmlparserCppTest *this,string *expected_column)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  int column;
  
  column = (int)((ulong)in_RAX >> 0x20);
  bVar1 = safe_strto32(expected_column,&column);
  if (bVar1) {
    iVar2 = HtmlParser::column_number(&this->parser_);
    if (column == iVar2) {
      return;
    }
    fprintf(_stderr,"Check failed: %s %s %s\n","column","==","parser_.column_number()");
  }
  else {
    fprintf(_stderr,"Check failed: %s\n","safe_strto32(expected_column, &column)");
  }
  exit(1);
}

Assistant:

void HtmlparserCppTest::ValidateColumn(const string &expected_column) {
  int column;
  CHECK(safe_strto32(expected_column, &column));
  EXPECT_EQ(column, parser_.column_number())
      << "Unexpected column count at line " << parser_.line_number();
}